

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O1

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructAccessor
          (LobsterGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  pointer pcVar5;
  EnumVal *pEVar6;
  EnumDef *pEVar7;
  _Alloc_hider *p_Var8;
  long *plVar9;
  undefined8 *puVar10;
  size_t sVar11;
  long *plVar12;
  size_type *psVar13;
  undefined8 *puVar14;
  pointer ppEVar15;
  char *pcVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  Type *type;
  bool bVar19;
  string defval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string acc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def;
  string offsets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  undefined1 local_108 [24];
  uint16_t uStack_f0;
  undefined6 uStack_ee;
  LobsterGenerator *local_e8;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  string local_80;
  Type *local_60;
  FieldDef *local_58;
  string local_50;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"    ");
  NumToString<unsigned_short>(&local_a0,(field->value).offset);
  local_e8 = this;
  EscapeKeyword((string *)local_108,this,(string *)field);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x37b37c);
  local_c0 = &local_b0;
  plVar12 = plVar9 + 2;
  if ((long *)*plVar9 == plVar12) {
    local_b0 = *plVar12;
    lStack_a8 = plVar9[3];
  }
  else {
    local_b0 = *plVar12;
    local_c0 = (long *)*plVar9;
  }
  type = &(field->value).type;
  local_b8 = plVar9[1];
  *plVar9 = (long)plVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  p_Var8 = (_Alloc_hider *)(local_108 + 0x10);
  if ((_Alloc_hider *)local_108._0_8_ != p_Var8) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  BVar4 = (((Value *)type)->type).base_type;
  if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
    local_108._8_8_ = (StructDef *)0x0;
    local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
    if (struct_def->fixed == true) {
      local_108._0_8_ = p_Var8;
      GenTypeName_abi_cxx11_(&local_128,local_e8,type);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x37b385);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_148.field_2._M_allocated_capacity = *psVar13;
        local_148.field_2._8_8_ = plVar9[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *psVar13;
        local_148._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_148._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168.field_2._8_8_ = plVar9[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_168._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_168,(ulong)local_a0._M_dataplus._M_p);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_188.field_2._M_allocated_capacity = *psVar13;
        local_188.field_2._8_8_ = plVar9[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar13;
        local_188._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_188._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
      plVar12 = plVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_1a8.field_2._M_allocated_capacity = *plVar12;
        local_1a8.field_2._8_8_ = plVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *plVar12;
        local_1a8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1a8._M_string_length = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      uVar17 = local_128.field_2._M_allocated_capacity;
      _Var18._M_p = local_128._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
LAB_002a271c:
        operator_delete(_Var18._M_p,
                        (ulong)((long)&(((EnumDef *)uVar17)->super_Definition).name._M_dataplus._M_p
                               + 1));
      }
    }
    else {
      if (field->presence == kOptional) {
        bVar19 = BVar4 - BASE_TYPE_FLOAT < 2;
        pcVar16 = "0";
        if (bVar19) {
          pcVar16 = "0.0";
        }
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_108._0_8_ = p_Var8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,pcVar16,pcVar16 + (ulong)bVar19 * 2 + 1);
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        pcVar5 = (field->value).constant._M_dataplus._M_p;
        local_108._0_8_ = p_Var8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar5,pcVar5 + (field->value).constant._M_string_length);
      }
      GenTypeName_abi_cxx11_(&local_50,local_e8,type);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x37b400);
      plVar12 = plVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_80.field_2._M_allocated_capacity = *plVar12;
        local_80.field_2._8_8_ = plVar9[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = *plVar12;
        local_80._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_80._M_string_length = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_80);
      plVar12 = plVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_e0.field_2._M_allocated_capacity = *plVar12;
        local_e0.field_2._8_8_ = plVar9[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *plVar12;
        local_e0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_e0._M_string_length = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      local_60 = type;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      plVar12 = plVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_128.field_2._M_allocated_capacity = *plVar12;
        local_128.field_2._8_8_ = plVar9[3];
      }
      else {
        local_128.field_2._M_allocated_capacity = *plVar12;
        local_128._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_128._M_string_length = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_148.field_2._M_allocated_capacity = *psVar13;
        local_148.field_2._8_8_ = plVar9[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *psVar13;
        local_148._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_148._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)local_1a8._M_dataplus._M_p);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168.field_2._8_8_ = plVar9[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_168._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_188.field_2._M_allocated_capacity = *psVar13;
        local_188.field_2._8_8_ = plVar9[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar13;
        local_188._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_188._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      type = local_60;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,
                        (ulong)(local_80.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (((Type *)&type->base_type)->base_type == BASE_TYPE_BOOL) {
        std::operator+(&local_168,"bool(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188.field_2._8_8_ = plVar9[3];
          local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_188._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_108,(string *)&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != &local_188.field_2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
      uVar17 = local_1a8.field_2._M_allocated_capacity;
      _Var18._M_p = local_1a8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_002a271c;
    }
    pEVar7 = (field->value).type.enum_def;
    if (pEVar7 != (EnumDef *)0x0) {
      EscapeKeyword(&local_148,local_e8,(string *)pEVar7);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_148);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168.field_2._8_8_ = plVar9[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar13;
        local_168._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_168._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_188.field_2._M_allocated_capacity = *psVar13;
        local_188.field_2._8_8_ = plVar9[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar13;
        local_188._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_188._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
      plVar12 = plVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar12) {
        local_1a8.field_2._M_allocated_capacity = *plVar12;
        local_1a8.field_2._8_8_ = plVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *plVar12;
        local_1a8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1a8._M_string_length = plVar9[1];
      *plVar9 = (long)plVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    if (field->presence == kOptional) {
      std::operator+(&local_188,", flatbuffers.field_present(buf_, pos_, ",&local_a0);
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
      paVar1 = &local_1a8.field_2;
      psVar13 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_1a8.field_2._M_allocated_capacity = *psVar13;
        local_1a8.field_2._8_8_ = plVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar13;
        local_1a8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_1a8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar13;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_108,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_188.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_c0,local_b8 + (long)local_c0);
      std::__cxx11::string::append((char *)&local_128);
      LobsterType_abi_cxx11_(&local_e0,local_e8,type);
      uVar17 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar17 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length)) {
        uVar17 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar17 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length))
        goto LAB_002a2b15;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_e0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      }
      else {
LAB_002a2b15:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_128,(ulong)local_e0._M_dataplus._M_p);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_148.field_2._M_allocated_capacity = *puVar14;
        local_148.field_2._8_8_ = puVar10[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar14;
        local_148._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_148._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_168.field_2._M_allocated_capacity = *puVar14;
        local_168.field_2._8_8_ = puVar10[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar14;
        local_168._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_168._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_188.field_2._M_allocated_capacity = *puVar14;
        local_188.field_2._8_8_ = puVar10[3];
        local_188._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar14;
        local_188._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_188._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8.field_2._8_8_ = puVar10[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1a8._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
LAB_002a2d0c:
        operator_delete(local_148._M_dataplus._M_p,
                        (ulong)(local_148.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_c0,local_b8 + (long)local_c0);
      std::__cxx11::string::append((char *)&local_128);
      LobsterType_abi_cxx11_(&local_e0,local_e8,type);
      uVar17 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar17 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length)) {
        uVar17 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar17 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length))
        goto LAB_002a29e4;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_e0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      }
      else {
LAB_002a29e4:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_128,(ulong)local_e0._M_dataplus._M_p);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_148.field_2._M_allocated_capacity = *puVar14;
        local_148.field_2._8_8_ = puVar10[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar14;
        local_148._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_148._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_168.field_2._M_allocated_capacity = *puVar14;
        local_168.field_2._8_8_ = puVar10[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar14;
        local_168._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_168._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_188.field_2._M_allocated_capacity = *puVar14;
        local_188.field_2._8_8_ = puVar10[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar14;
        local_188._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_188._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8.field_2._8_8_ = puVar10[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1a8._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_002a2d0c;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    uVar17 = local_108._16_8_;
    _Var18._M_p = (pointer)local_108._0_8_;
    if ((_Alloc_hider *)local_108._0_8_ == (_Alloc_hider *)(local_108 + 0x10)) goto LAB_002a4286;
  }
  else {
    switch(BVar4) {
    case BASE_TYPE_STRING:
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      local_60 = type;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
      std::__cxx11::string::append((char *)&local_188);
      puVar10 = (undefined8 *)
                std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_a0._M_dataplus._M_p)
      ;
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8.field_2._8_8_ = puVar10[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1a8._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_108._16_8_ = *puVar14;
        _uStack_f0 = puVar10[3];
        local_108._0_8_ = p_Var8;
      }
      else {
        local_108._16_8_ = *puVar14;
        local_108._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar10;
      }
      local_108._8_8_ = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,local_108._0_8_);
      if ((_Alloc_hider *)local_108._0_8_ != p_Var8) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      uVar17 = local_188.field_2._M_allocated_capacity;
      _Var18._M_p = local_188._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_002a4104:
        operator_delete(_Var18._M_p,
                        (ulong)((long)&(((EnumDef *)uVar17)->super_Definition).name._M_dataplus._M_p
                               + 1));
      }
      break;
    case BASE_TYPE_VECTOR:
      local_108._0_4_ = (field->value).type.element;
      local_108._8_8_ = (field->value).type.struct_def;
      local_108._16_8_ = (field->value).type.enum_def;
      local_108._4_4_ = 0;
      uStack_f0 = (field->value).type.fixed_length;
      if (local_108._0_4_ == BASE_TYPE_STRING) {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_60 = type;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::append((char *)code_ptr);
      }
      else {
        if (local_108._0_4_ == BASE_TYPE_STRUCT) {
          local_60 = type;
          std::operator+(&local_168,"flatbuffers.field_vector(buf_, pos_, ",&local_a0);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
          paVar1 = &local_188.field_2;
          plVar12 = plVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar12) {
            local_188.field_2._M_allocated_capacity = *plVar12;
            local_188.field_2._8_8_ = plVar9[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *plVar12;
            local_188._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_188._M_string_length = plVar9[1];
          *plVar9 = (long)plVar12;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          sVar11 = InlineSize((Type *)local_108);
          NumToString<unsigned_long>(&local_148,sVar11);
          uVar17 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            uVar17 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < (EnumDef *)(local_148._M_string_length + local_188._M_string_length))
          {
            uVar17 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              uVar17 = local_148.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < (EnumDef *)(local_148._M_string_length + local_188._M_string_length)
               ) goto LAB_002a3709;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_148,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
          }
          else {
LAB_002a3709:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_188,(ulong)local_148._M_dataplus._M_p);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_1a8.field_2._M_allocated_capacity = *puVar14;
            local_1a8.field_2._8_8_ = puVar10[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar14;
            local_1a8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_1a8._M_string_length = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)puVar14 = 0;
          paVar2 = &local_148.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          paVar3 = &local_168.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar3) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if (*(bool *)(local_108._8_8_ + 0x110) == false) {
            std::operator+(&local_168,"flatbuffers.indirect(buf_, ",&local_1a8);
            plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
            plVar12 = plVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar12) {
              local_188.field_2._M_allocated_capacity = *plVar12;
              local_188.field_2._8_8_ = plVar9[3];
              local_188._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_188.field_2._M_allocated_capacity = *plVar12;
              local_188._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_188._M_string_length = plVar9[1];
            *plVar9 = (long)plVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar1) {
              operator_delete(local_188._M_dataplus._M_p,
                              (ulong)(local_188.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != paVar3) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
          }
          local_148._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_c0,local_b8 + (long)local_c0);
          std::__cxx11::string::append((char *)&local_148);
          NamespacedName_abi_cxx11_
                    (&local_128,local_e8,&((field->value).type.struct_def)->super_Definition);
          uVar17 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            uVar17 = local_148.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < (EnumDef *)(local_128._M_string_length + local_148._M_string_length))
          {
            uVar17 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              uVar17 = local_128.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < (EnumDef *)(local_128._M_string_length + local_148._M_string_length)
               ) goto LAB_002a3e21;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace
                                ((ulong)&local_128,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
          }
          else {
LAB_002a3e21:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_148,(ulong)local_128._M_dataplus._M_p);
          }
          psVar13 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_168.field_2._M_allocated_capacity = *psVar13;
            local_168.field_2._8_8_ = puVar10[3];
            local_168._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_168.field_2._M_allocated_capacity = *psVar13;
            local_168._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_168._M_string_length = puVar10[1];
          *puVar10 = psVar13;
          puVar10[1] = 0;
          *(undefined1 *)psVar13 = 0;
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_168);
          psVar13 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar13) {
            local_188.field_2._M_allocated_capacity = *psVar13;
            local_188.field_2._8_8_ = plVar9[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar13;
            local_188._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_188._M_string_length = plVar9[1];
          *plVar9 = (long)psVar13;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar3) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          NamespacedName_abi_cxx11_
                    (&local_128,local_e8,&((field->value).type.struct_def)->super_Definition);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
          puVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_148.field_2._M_allocated_capacity = *puVar14;
            local_148.field_2._8_8_ = puVar10[3];
            local_148._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar14;
            local_148._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_148._M_string_length = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_148,(ulong)local_1a8._M_dataplus._M_p);
          puVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_168.field_2._M_allocated_capacity = *puVar14;
            local_168.field_2._8_8_ = puVar10[3];
            local_168._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_168.field_2._M_allocated_capacity = *puVar14;
            local_168._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_168._M_string_length = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
          puVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_188.field_2._M_allocated_capacity = *puVar14;
            local_188.field_2._8_8_ = puVar10[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar14;
            local_188._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_188._M_string_length = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar3) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          uVar17 = local_1a8.field_2._M_allocated_capacity;
          _Var18._M_p = local_1a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_002a4104;
          break;
        }
        paVar1 = &local_168.field_2;
        local_168._M_dataplus._M_p = (pointer)paVar1;
        local_60 = type;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_168);
        LobsterType_abi_cxx11_(&local_148,local_e8,(Type *)local_108);
        uVar17 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          uVar17 = local_168.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < (EnumDef *)(local_148._M_string_length + local_168._M_string_length)) {
          uVar17 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            uVar17 = local_148.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar17 < (EnumDef *)(local_148._M_string_length + local_168._M_string_length))
          goto LAB_002a306a;
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_148,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
        }
        else {
LAB_002a306a:
          puVar10 = (undefined8 *)
                    std::__cxx11::string::_M_append
                              ((char *)&local_168,(ulong)local_148._M_dataplus._M_p);
        }
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        psVar13 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188.field_2._8_8_ = puVar10[3];
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_188._M_string_length = puVar10[1];
        *puVar10 = psVar13;
        puVar10[1] = 0;
        *(undefined1 *)psVar13 = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
        paVar2 = &local_1a8.field_2;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8.field_2._8_8_ = plVar9[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1a8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        paVar3 = &local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        GenTypeName_abi_cxx11_(&local_168,local_e8,(Type *)local_108);
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x37b38a);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188.field_2._8_8_ = puVar10[3];
          local_188._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_188._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
        plVar12 = plVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          local_1a8.field_2._M_allocated_capacity = *plVar12;
          local_1a8.field_2._8_8_ = plVar9[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *plVar12;
          local_1a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1a8._M_string_length = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
      }
      std::operator+(&local_148,"(buf_, buf_.flatbuffers.field_vector(pos_, ",&local_a0);
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      paVar1 = &local_168.field_2;
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_168.field_2._M_allocated_capacity = *puVar14;
        local_168.field_2._8_8_ = puVar10[3];
        local_168._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar14;
        local_168._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_168._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      sVar11 = InlineSize((Type *)local_108);
      NumToString<unsigned_long>(&local_128,sVar11);
      uVar17 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        uVar17 = local_168.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar17 < (EnumDef *)(local_128._M_string_length + local_168._M_string_length)) {
        uVar17 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          uVar17 = local_128.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar17 < (EnumDef *)(local_128._M_string_length + local_168._M_string_length))
        goto LAB_002a3ac0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_128,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
      }
      else {
LAB_002a3ac0:
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)local_128._M_dataplus._M_p);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_188.field_2._M_allocated_capacity = *puVar14;
        local_188.field_2._8_8_ = puVar10[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar14;
        local_188._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_188._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)puVar14 = 0;
      puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar14 = puVar10 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8.field_2._8_8_ = puVar10[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar14;
        local_1a8._M_dataplus._M_p = (pointer)*puVar10;
      }
      local_1a8._M_string_length = puVar10[1];
      *puVar10 = puVar14;
      puVar10[1] = 0;
      *(undefined1 *)(puVar10 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
      uVar17 = local_148.field_2._M_allocated_capacity;
      _Var18._M_p = local_148._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_002a4104;
      break;
    case BASE_TYPE_STRUCT:
      local_60 = type;
      NamespacedName_abi_cxx11_
                ((string *)local_108,local_e8,&((field->value).type.struct_def)->super_Definition);
      if (struct_def->fixed == true) {
        paVar1 = &local_168.field_2;
        local_168._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_168);
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
        paVar2 = &local_188.field_2;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188.field_2._8_8_ = plVar9[3];
          local_188._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar13;
          local_188._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_188._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
        paVar3 = &local_1a8.field_2;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8.field_2._8_8_ = plVar9[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1a8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_148,"return ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_168.field_2._M_allocated_capacity = *puVar14;
          local_168.field_2._8_8_ = puVar10[3];
          local_168._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar14;
          local_168._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_168._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)local_a0._M_dataplus._M_p);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188.field_2._8_8_ = puVar10[3];
          local_188._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_188._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_1a8.field_2._M_allocated_capacity = *puVar14;
          local_1a8.field_2._8_8_ = puVar10[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar14;
          local_1a8._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_1a8._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        uVar17 = local_148.field_2._M_allocated_capacity;
        _Var18._M_p = local_148._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_002a3776;
      }
      else {
        paVar1 = &local_188.field_2;
        local_188._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_188);
        plVar9 = (long *)std::__cxx11::string::_M_append((char *)&local_188,local_108._0_8_);
        paVar2 = &local_1a8.field_2;
        psVar13 = (size_type *)(plVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar13) {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8.field_2._8_8_ = plVar9[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar13;
          local_1a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1a8._M_string_length = plVar9[1];
        *plVar9 = (long)psVar13;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if (field->presence != kRequired) {
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::__cxx11::string::append((char *)code_ptr);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"let o = flatbuffers.field_","");
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_148.field_2._M_allocated_capacity = *puVar14;
          local_148.field_2._8_8_ = puVar10[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar14;
          local_148._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_148._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_168.field_2._M_allocated_capacity = *puVar14;
          local_168.field_2._8_8_ = puVar10[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar14;
          local_168._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_168._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        puVar10 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)local_a0._M_dataplus._M_p);
        puVar14 = puVar10 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar14) {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188.field_2._8_8_ = puVar10[3];
          local_188._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar14;
          local_188._M_dataplus._M_p = (pointer)*puVar10;
        }
        local_188._M_string_length = puVar10[1];
        *puVar10 = puVar14;
        puVar10[1] = 0;
        *(undefined1 *)(puVar10 + 2) = 0;
        plVar9 = (long *)std::__cxx11::string::append((char *)&local_188);
        plVar12 = plVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar12) {
          local_1a8.field_2._M_allocated_capacity = *plVar12;
          local_1a8.field_2._8_8_ = plVar9[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *plVar12;
          local_1a8._M_dataplus._M_p = (pointer)*plVar9;
        }
        local_1a8._M_string_length = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        if (field->presence == kRequired) {
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_108._0_8_,
                     (char *)(local_108._0_8_ + (long)(Definition *)local_108._8_8_));
          std::__cxx11::string::append((char *)&local_1a8);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
          uVar17 = local_1a8.field_2._M_allocated_capacity;
          _Var18._M_p = local_1a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) goto LAB_002a3776;
        }
        else {
          std::operator+(&local_188,"if o: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          puVar14 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar14) {
            local_1a8.field_2._M_allocated_capacity = *puVar14;
            local_1a8.field_2._8_8_ = puVar10[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar14;
            local_1a8._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_1a8._M_string_length = puVar10[1];
          *puVar10 = puVar14;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          uVar17 = local_188.field_2._M_allocated_capacity;
          _Var18._M_p = local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
LAB_002a3776:
            operator_delete(_Var18._M_p,
                            (ulong)((long)&(((EnumDef *)uVar17)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
        }
      }
      uVar17 = local_108._16_8_;
      _Var18._M_p = (pointer)local_108._0_8_;
      if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) goto LAB_002a4104;
      break;
    case BASE_TYPE_UNION:
      pEVar7 = (field->value).type.enum_def;
      ppEVar15 = (pEVar7->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_60 = type;
      local_58 = field;
      if (ppEVar15 !=
          (pEVar7->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar1 = &local_148.field_2;
        do {
          pEVar6 = *ppEVar15;
          if (pEVar6->value != 0) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,local_c0,local_b8 + (long)local_c0);
            std::__cxx11::string::append((char *)&local_e0);
            plVar9 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_e0,(ulong)(pEVar6->name)._M_dataplus._M_p);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            plVar12 = plVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar12) {
              local_128.field_2._M_allocated_capacity = *plVar12;
              local_128.field_2._8_8_ = plVar9[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *plVar12;
              local_128._M_dataplus._M_p = (pointer)*plVar9;
            }
            local_128._M_string_length = plVar9[1];
            *plVar9 = (long)plVar12;
            plVar9[1] = 0;
            *(undefined1 *)(plVar9 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_148.field_2._M_allocated_capacity = *puVar14;
              local_148.field_2._8_8_ = puVar10[3];
              local_148._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar14;
              local_148._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_148._M_string_length = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            NamespacedName_abi_cxx11_
                      (&local_80,local_e8,&((pEVar6->union_type).struct_def)->super_Definition);
            uVar17 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              uVar17 = local_148.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar17 < (EnumDef *)(local_80._M_string_length + local_148._M_string_length))
            {
              uVar17 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_80._M_dataplus._M_p != &local_80.field_2) {
                uVar17 = local_80.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar17 <
                  (EnumDef *)(local_80._M_string_length + local_148._M_string_length))
              goto LAB_002a1caa;
              puVar10 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_80,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p)
              ;
            }
            else {
LAB_002a1caa:
              puVar10 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_148,(ulong)local_80._M_dataplus._M_p);
            }
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_168.field_2._M_allocated_capacity = *puVar14;
              local_168.field_2._8_8_ = puVar10[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *puVar14;
              local_168._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_168._M_string_length = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)puVar14 = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_188.field_2._M_allocated_capacity = *puVar14;
              local_188.field_2._8_8_ = puVar10[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar14;
              local_188._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_188._M_string_length = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_188,(ulong)local_a0._M_dataplus._M_p);
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_1a8.field_2._M_allocated_capacity = *puVar14;
              local_1a8.field_2._8_8_ = puVar10[3];
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar14;
              local_1a8._M_dataplus._M_p = (pointer)*puVar10;
            }
            local_1a8._M_string_length = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_108._0_8_ = local_108 + 0x10;
            puVar14 = puVar10 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar10 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_108._16_8_ = *puVar14;
              _uStack_f0 = puVar10[3];
            }
            else {
              local_108._16_8_ = *puVar14;
              local_108._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar10;
            }
            local_108._8_8_ = puVar10[1];
            *puVar10 = puVar14;
            puVar10[1] = 0;
            *(undefined1 *)(puVar10 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,local_108._0_8_);
            if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,
                              (ulong)(local_188.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,
                              (ulong)(local_80.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              (ulong)(local_128.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              (ulong)(local_e0.field_2._M_allocated_capacity + 1));
            }
          }
          ppEVar15 = ppEVar15 + 1;
        } while (ppEVar15 !=
                 (((local_58->value).type.enum_def)->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_lobster.cpp"
                    ,0xd0,
                    "void flatbuffers::lobster::LobsterGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *)"
                   );
    }
    BVar4 = ((Type *)&local_60->base_type)->base_type;
    if ((BVar4 != BASE_TYPE_VECTOR64) && (BVar4 != BASE_TYPE_VECTOR)) goto LAB_002a4286;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
    std::__cxx11::string::append((char *)&local_188);
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_a0._M_dataplus._M_p);
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_1a8.field_2._M_allocated_capacity = *puVar14;
      local_1a8.field_2._8_8_ = puVar10[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar14;
      local_1a8._M_dataplus._M_p = (pointer)*puVar10;
    }
    local_1a8._M_string_length = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    puVar14 = puVar10 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar14) {
      local_108._16_8_ = *puVar14;
      _uStack_f0 = puVar10[3];
      local_108._0_8_ = (_Alloc_hider *)(local_108 + 0x10);
    }
    else {
      local_108._16_8_ = *puVar14;
      local_108._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar10;
    }
    local_108._8_8_ = puVar10[1];
    *puVar10 = puVar14;
    puVar10[1] = 0;
    *(undefined1 *)(puVar10 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,local_108._0_8_);
    if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    uVar17 = local_188.field_2._M_allocated_capacity;
    _Var18._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_002a4286;
  }
  operator_delete(_Var18._M_p,
                  (ulong)((long)&(((EnumDef *)uVar17)->super_Definition).name._M_dataplus._M_p + 1))
  ;
LAB_002a4286:
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, "    ");
    std::string &code = *code_ptr;
    auto offsets = NumToString(field.value.offset);
    auto def = "    def " + NormalizedName(field);
    if (IsScalar(field.value.type.base_type)) {
      std::string acc;
      if (struct_def.fixed) {
        acc = "buf_.read_" + GenTypeName(field.value.type) + "_le(pos_ + " +
              offsets + ")";

      } else {
        auto defval = field.IsOptional()
                          ? (IsFloat(field.value.type.base_type) ? "0.0" : "0")
                          : field.value.constant;
        acc = "flatbuffers.field_" + GenTypeName(field.value.type) +
              "(buf_, pos_, " + offsets + ", " + defval + ")";
        if (IsBool(field.value.type.base_type)) acc = "bool(" + acc + ")";
      }
      if (field.value.type.enum_def)
        acc = NormalizedName(*field.value.type.enum_def) + "(" + acc + ")";
      if (field.IsOptional()) {
        acc += ", flatbuffers.field_present(buf_, pos_, " + offsets + ")";
        code += def + "() -> " + LobsterType(field.value.type) +
                ", bool:\n        return " + acc + "\n";
      } else {
        code += def + "() -> " + LobsterType(field.value.type) +
                ":\n        return " + acc + "\n";
      }
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        auto name = NamespacedName(*field.value.type.struct_def);
        if (struct_def.fixed) {
          code += def + "() -> " + name + ":\n        ";
          code += "return " + name + "{ buf_, pos_ + " + offsets + " }\n";
        } else {
          code += def + "() -> " + name;
          if (!field.IsRequired()) code += "?";
          code += ":\n        ";
          code += std::string("let o = flatbuffers.field_") +
                  (field.value.type.struct_def->fixed ? "struct" : "table") +
                  "(buf_, pos_, " + offsets + ")\n        return ";
          if (field.IsRequired()) {
            code += name + " { buf_, assert o }\n";
          } else {
            code += "if o: " + name + " { buf_, o } else: nil\n";
          }
        }
        break;
      }
      case BASE_TYPE_STRING:
        code += def +
                "() -> string:\n        return "
                "flatbuffers.field_string(buf_, pos_, " +
                offsets + ")\n";
        break;
      case BASE_TYPE_VECTOR: {
        auto vectortype = field.value.type.VectorType();
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          auto start = "flatbuffers.field_vector(buf_, pos_, " + offsets +
                       ") + i * " + NumToString(InlineSize(vectortype));
          if (!(vectortype.struct_def->fixed)) {
            start = "flatbuffers.indirect(buf_, " + start + ")";
          }
          code += def + "(i:int) -> " +
                  NamespacedName(*field.value.type.struct_def) +
                  ":\n        return ";
          code += NamespacedName(*field.value.type.struct_def) + " { buf_, " +
                  start + " }\n";
        } else {
          if (IsString(vectortype)) {
            code += def + "(i:int) -> string:\n        return ";
            code += "flatbuffers.string";
          } else {
            code += def + "(i:int) -> " + LobsterType(vectortype) +
                    ":\n        return ";
            code += "read_" + GenTypeName(vectortype) + "_le";
          }
          code += "(buf_, buf_.flatbuffers.field_vector(pos_, " + offsets +
                  ") + i * " + NumToString(InlineSize(vectortype)) + ")\n";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        for (auto it = field.value.type.enum_def->Vals().begin();
             it != field.value.type.enum_def->Vals().end(); ++it) {
          auto &ev = **it;
          if (ev.IsNonZero()) {
            code += def + "_as_" + ev.name + "():\n        return " +
                    NamespacedName(*ev.union_type.struct_def) +
                    " { buf_, flatbuffers.field_table(buf_, pos_, " + offsets +
                    ") }\n";
          }
        }
        break;
      }
      default: FLATBUFFERS_ASSERT(0);
    }
    if (IsVector(field.value.type)) {
      code += def +
              "_length() -> int:\n        return "
              "flatbuffers.field_vector_len(buf_, pos_, " +
              offsets + ")\n";
    }
  }